

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

double __thiscall
SimpleConfiguration::polyFunc
          (SimpleConfiguration *this,double x,int order,vector<double,_std::allocator<double>_> *a)

{
  reference pvVar1;
  undefined4 local_3c;
  double dStack_38;
  int i;
  double res;
  double base;
  vector<double,_std::allocator<double>_> *a_local;
  int order_local;
  double x_local;
  SimpleConfiguration *this_local;
  
  res = 1.0;
  dStack_38 = 0.0;
  for (local_3c = 0; local_3c <= order; local_3c = local_3c + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](a,(long)local_3c);
    dStack_38 = *pvVar1 * res + dStack_38;
    res = x * res;
  }
  return dStack_38;
}

Assistant:

double polyFunc(double x, int order, vector<double> &a) {
        double base = 1.0;
        double res = 0.0;
        for (int i = 0; i <= order; ++i) {
            res += a[i] * base;
            base *= x;
        }
        return res;
    }